

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.hpp
# Opt level: O3

void __thiscall Sinclair::ZXSpectrum::State::State(State *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Struct *str_1;
  Struct *str;
  Struct *str_2;
  string local_50;
  
  (this->super_StructImpl<Sinclair::ZXSpectrum::State>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__005a3130;
  CPU::Z80::State::State(&this->z80);
  ZXSpectrum::Video::State::State(&this->video);
  *(undefined8 *)
   ((long)&(this->ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  GI::AY38910::State::State(&this->ay);
  this->last_1ffd = '\0';
  if (Reflection::StructImpl<Sinclair::ZXSpectrum::State>::contents__abi_cxx11_._M_h.
      _M_element_count == 0) {
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"z80","");
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare_emplace<Reflection::Struct>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,(Struct *)&this->z80,&local_50,1
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"video","");
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare_emplace<Reflection::Struct>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,(Struct *)&this->video,&local_50
               ,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ram","");
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::
    declare_emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->ram,&local_50,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"last_7ffd","");
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->last_7ffd,&local_50,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"last_1ffd","");
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->last_1ffd,&local_50,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ay","");
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare_emplace<Reflection::Struct>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,(Struct *)&this->ay,&local_50,1)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

State() {
		if(needs_declare()) {
			DeclareField(z80);
			DeclareField(video);
			DeclareField(ram);
			DeclareField(last_7ffd);
			DeclareField(last_1ffd);
			DeclareField(ay);
		}
	}